

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::RepeatedRemoveDirectory(string *dir)

{
  bool bVar1;
  int local_1c;
  int i;
  string *dir_local;
  
  local_1c = 0;
  while( true ) {
    if (9 < local_1c) {
      return false;
    }
    bVar1 = cmsys::SystemTools::RemoveADirectory(dir);
    if (bVar1) break;
    cmsys::SystemTools::Delay(100);
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool cmSystemTools::RepeatedRemoveDirectory(const std::string& dir)
{
  // Windows sometimes locks files temporarily so try a few times.
  for (int i = 0; i < 10; ++i) {
    if (cmSystemTools::RemoveADirectory(dir)) {
      return true;
    }
    cmSystemTools::Delay(100);
  }
  return false;
}